

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeData.cpp
# Opt level: O0

void __thiscall TPZShapeData::TPZShapeData(TPZShapeData *this)

{
  TPZRegisterClassId *in_RDI;
  TPZManVector<int,_27> *this_00;
  TPZRegisterClassId *size;
  TPZFNMatrix<243,_double> *this_01;
  int64_t in_stack_00000018;
  TPZManVector<TPZTransform<double>,_20> *in_stack_00000020;
  TPZFNMatrix<180,_double> *in_stack_ffffffffffffff90;
  int64_t in_stack_ffffffffffffff98;
  TPZManVector<int,_27> *in_stack_ffffffffffffffa0;
  int64_t in_stack_ffffffffffffffd8;
  TPZManVector<std::pair<int,_long>,_60> *in_stack_ffffffffffffffe0;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZShapeData>(in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02478a70);
  *(undefined ***)in_RDI = &PTR__TPZShapeData_02478a18;
  *(undefined ***)in_RDI = &PTR__TPZShapeData_02478a18;
  *(undefined4 *)(in_RDI + 8) = 0;
  TPZManVector<long,_8>::TPZManVector
            ((TPZManVector<long,_8> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  TPZManVector<int,_27>::TPZManVector(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  TPZManVector<int,_27>::TPZManVector(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  TPZManVector<TPZTransform<double>,_20>::TPZManVector(in_stack_00000020,in_stack_00000018);
  TPZManVector<int,_20>::TPZManVector
            ((TPZManVector<int,_20> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  this_00 = (TPZManVector<int,_27> *)(in_RDI + 0x22a0);
  TPZFNMatrix<60,_double>::TPZFNMatrix((TPZFNMatrix<60,_double> *)in_stack_ffffffffffffff90);
  size = in_RDI + 0x2518;
  TPZFNMatrix<180,_double>::TPZFNMatrix(in_stack_ffffffffffffff90);
  this_01 = (TPZFNMatrix<243,_double> *)(in_RDI + 0x2b50);
  TPZManVector<int,_27>::TPZManVector(this_00,(int64_t)size);
  TPZManVector<int,_27>::TPZManVector(this_00,(int64_t)size);
  TPZManVector<int,_20>::TPZManVector((TPZManVector<int,_20> *)this_00,(int64_t)size);
  TPZFNMatrix<243,_double>::TPZFNMatrix(this_01);
  TPZManVector<std::pair<int,_long>,_60>::TPZManVector
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

TPZShapeData::TPZShapeData() :
    TPZRegisterClassId(&TPZShapeData::ClassId)
{

}